

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

CallReaction testing::Mock::GetReactionOnUninterestingCalls(void *mock_obj)

{
  size_type sVar1;
  mapped_type *pmVar2;
  key_type *in_RDI;
  map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
  *unaff_retaddr;
  MutexLock l;
  MutexBase *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  key_type *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  CallReaction CVar3;
  
  internal::GTestMutexLock::GTestMutexLock
            ((GTestMutexLock *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  sVar1 = std::
          map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
          ::count((map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
                   *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffc8);
  if (sVar1 == 0) {
    CVar3 = kDefault;
  }
  else {
    pmVar2 = std::
             map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
             ::operator[](unaff_retaddr,in_RDI);
    CVar3 = *pmVar2;
  }
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x134cbd);
  return CVar3;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  return (g_uninteresting_call_reaction.count(mock_obj) == 0) ?
      internal::kDefault : g_uninteresting_call_reaction[mock_obj];
}